

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

size_t printDisp32(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm,long MyNumber)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  
  if ((((pMyDisasm->Reserved_).RM_ == 4) && ((pMyDisasm->Reserved_).BASE_ == 4)) &&
     (0x1f < (pMyDisasm->Reserved_).Architecture)) {
    if ((pMyDisasm->Instruction).Opcode == 0x8f) {
      iVar1 = (pMyDisasm->Reserved_).OperandSize;
      iVar4 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      lVar3 = (long)(iVar4 >> 3);
    }
    else {
      lVar3 = 0;
    }
    MyNumber = MyNumber + lVar3;
  }
  if (MyNumber < 0) {
    (pMyOperand->OpMnemonic + i)[0] = '-';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    MyNumber = -MyNumber;
  }
  else {
    (pMyOperand->OpMnemonic + i)[0] = '+';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
  }
  sVar2 = CopyFormattedNumber(pMyDisasm,pMyOperand->OpMnemonic + i + 1,"%.8X",MyNumber);
  return sVar2 + i + 1;
}

Assistant:

size_t __bea_callspec__ printDisp32(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm, long MyNumber)
{
  size_t j;

  if ((GV.RM_ == 4) && (GV.BASE_ == 4) && (GV.Architecture >=32)) {
    MyNumber += specificPop(pMyDisasm);
  }

  if (MyNumber < 0) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "-");
      #endif
      i ++;
      j=i;
      #ifndef BEA_LIGHT_DISASSEMBLY
         i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) ~MyNumber+1);
      #endif
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i ++;
      j = i;
      #ifndef BEA_LIGHT_DISASSEMBLY
         i+= CopyFormattedNumber(pMyDisasm, (char*) pMyOperand->OpMnemonic+j,"%.8X",(Int64) MyNumber);
      #endif
  }

  return i;
}